

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-threadpool-cancel.c
# Opt level: O0

int run_test_threadpool_cancel_single(void)

{
  int iVar1;
  int64_t eval_b_5;
  int64_t eval_a_5;
  int64_t eval_b_4;
  int64_t eval_a_4;
  int64_t eval_b_3;
  int64_t eval_a_3;
  int64_t eval_b_2;
  int64_t eval_a_2;
  int64_t eval_b_1;
  int64_t eval_a_1;
  int64_t eval_b;
  int64_t eval_a;
  uv_work_t req;
  uv_loop_t *loop;
  
  saturate_threadpool();
  req.work_req.wq.prev = (uv__queue *)uv_default_loop();
  iVar1 = uv_queue_work((uv_loop_t *)req.work_req.wq.prev,(uv_work_t *)&eval_a,abort,nop_done_cb);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-threadpool-cancel.c"
            ,0x178,"uv_queue_work(loop, &req, (uv_work_cb) abort, nop_done_cb)","==","0",(long)iVar1
            ,"==",0);
    abort();
  }
  iVar1 = uv_cancel((uv_req_t *)&eval_a);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-threadpool-cancel.c"
            ,0x179,"uv_cancel((uv_req_t*) &req)","==","0",(long)iVar1,"==",0);
    abort();
  }
  if ((ulong)done_cb_called != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-threadpool-cancel.c"
            ,0x17a,"done_cb_called","==","0",(ulong)done_cb_called,"==",0);
    abort();
  }
  unblock_threadpool();
  iVar1 = uv_run((uv_loop_t *)req.work_req.wq.prev,UV_RUN_DEFAULT);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-threadpool-cancel.c"
            ,0x17c,"uv_run(loop, UV_RUN_DEFAULT)","==","0",(long)iVar1,"==",0);
    abort();
  }
  if ((ulong)done_cb_called != 1) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-threadpool-cancel.c"
            ,0x17d,"1","==","done_cb_called",1,"==",(ulong)done_cb_called);
    abort();
  }
  close_loop((uv_loop_t *)req.work_req.wq.prev);
  iVar1 = uv_loop_close((uv_loop_t *)req.work_req.wq.prev);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-threadpool-cancel.c"
            ,0x17f,"0","==","uv_loop_close(loop)",0,"==",(long)iVar1);
    abort();
  }
  uv_library_shutdown();
  return 0;
}

Assistant:

TEST_IMPL(threadpool_cancel_single) {
  uv_loop_t* loop;
  uv_work_t req;

  saturate_threadpool();
  loop = uv_default_loop();
  ASSERT_OK(uv_queue_work(loop, &req, (uv_work_cb) abort, nop_done_cb));
  ASSERT_OK(uv_cancel((uv_req_t*) &req));
  ASSERT_OK(done_cb_called);
  unblock_threadpool();
  ASSERT_OK(uv_run(loop, UV_RUN_DEFAULT));
  ASSERT_EQ(1, done_cb_called);

  MAKE_VALGRIND_HAPPY(loop);
  return 0;
}